

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_mul_txx9(DisasContext_conflict6 *ctx,uint32_t opc,int rd,int rs,int rt)

{
  TCGContext_conflict6 *tcg_ctx;
  TCGv_i64 t;
  TCGv_i64 t_00;
  TCGv_i32 ret;
  TCGv_i64 ret_00;
  TCGv_i32 ret_01;
  long lVar1;
  
  tcg_ctx = ctx->uc->tcg_ctx;
  t = tcg_temp_new_i64(tcg_ctx);
  t_00 = tcg_temp_new_i64(tcg_ctx);
  gen_load_gpr(tcg_ctx,t,rs);
  gen_load_gpr(tcg_ctx,t_00,rt);
  switch(opc) {
  case 0x70000018:
    lVar1 = 1;
    break;
  case 0x70000019:
    lVar1 = 1;
LAB_0088ab60:
    ret_01 = tcg_temp_new_i32(tcg_ctx);
    ret = tcg_temp_new_i32(tcg_ctx);
    tcg_gen_extrl_i64_i32_mips64el(tcg_ctx,ret_01,t);
    tcg_gen_extrl_i64_i32_mips64el(tcg_ctx,ret,t_00);
    tcg_gen_mulu2_i32_mips64el(tcg_ctx,ret_01,ret,ret_01,ret);
    goto LAB_0088aba6;
  case 0x7000001a:
  case 0x7000001b:
  case 0x7000001c:
  case 0x7000001d:
  case 0x7000001e:
  case 0x7000001f:
switchD_0088a9f4_caseD_7000001a:
    generate_exception_end(ctx,0x14);
    goto LAB_0088ac05;
  case 0x70000020:
    lVar1 = 1;
LAB_0088aa93:
    ret = (TCGv_i32)tcg_temp_new_i64(tcg_ctx);
    ret_00 = tcg_temp_new_i64(tcg_ctx);
    goto LAB_0088aaa9;
  case 0x70000021:
    lVar1 = 1;
LAB_0088aa5b:
    ret = (TCGv_i32)tcg_temp_new_i64(tcg_ctx);
    ret_00 = tcg_temp_new_i64(tcg_ctx);
    tcg_gen_ext32u_i64_mips64el(tcg_ctx,t,t);
    tcg_gen_ext32u_i64_mips64el(tcg_ctx,t_00,t_00);
LAB_0088aaa9:
    tcg_gen_mov_i64_mips64el(tcg_ctx,(TCGv_i64)ret,t);
    tcg_gen_mov_i64_mips64el(tcg_ctx,ret_00,t_00);
    tcg_gen_mul_i64_mips64el(tcg_ctx,(TCGv_i64)ret,(TCGv_i64)ret,ret_00);
    tcg_gen_concat32_i64(tcg_ctx,ret_00,tcg_ctx->cpu_LO[lVar1],tcg_ctx->cpu_HI[lVar1]);
    tcg_gen_add_i64(tcg_ctx,(TCGv_i64)ret,(TCGv_i64)ret,ret_00);
    tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(ret_00 + (long)tcg_ctx));
    tcg_gen_ext32s_i64_mips64el(tcg_ctx,tcg_ctx->cpu_LO[lVar1],(TCGv_i64)ret);
    gen_move_high32(tcg_ctx,tcg_ctx->cpu_HI[lVar1],(TCGv_i64)ret);
    if (rd != 0) {
      tcg_gen_ext32s_i64_mips64el(tcg_ctx,tcg_ctx->cpu_gpr[(uint)rd],(TCGv_i64)ret);
    }
    goto LAB_0088abf7;
  default:
    lVar1 = 0;
    if (opc != 0x18) {
      if (opc != 0x19) {
        if (opc == 0x70000000) goto LAB_0088aa93;
        if (opc == 0x70000001) goto LAB_0088aa5b;
        goto switchD_0088a9f4_caseD_7000001a;
      }
      goto LAB_0088ab60;
    }
  }
  ret_01 = tcg_temp_new_i32(tcg_ctx);
  ret = tcg_temp_new_i32(tcg_ctx);
  tcg_gen_extrl_i64_i32_mips64el(tcg_ctx,ret_01,t);
  tcg_gen_extrl_i64_i32_mips64el(tcg_ctx,ret,t_00);
  tcg_gen_muls2_i32_mips64el(tcg_ctx,ret_01,ret,ret_01,ret);
LAB_0088aba6:
  if (rd != 0) {
    tcg_gen_ext_i32_i64_mips64el(tcg_ctx,tcg_ctx->cpu_gpr[(uint)rd],ret_01);
  }
  tcg_gen_ext_i32_i64_mips64el(tcg_ctx,tcg_ctx->cpu_LO[lVar1],ret_01);
  tcg_gen_ext_i32_i64_mips64el(tcg_ctx,tcg_ctx->cpu_HI[lVar1],ret);
  tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(ret_01 + (long)tcg_ctx));
LAB_0088abf7:
  tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)((TCGv_i64)ret + (long)tcg_ctx));
LAB_0088ac05:
  tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(t + (long)tcg_ctx));
  tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(t_00 + (long)tcg_ctx));
  return;
}

Assistant:

static void gen_mul_txx9(DisasContext *ctx, uint32_t opc,
                         int rd, int rs, int rt)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0 = tcg_temp_new(tcg_ctx);
    TCGv t1 = tcg_temp_new(tcg_ctx);
    int acc = 0;

    gen_load_gpr(tcg_ctx, t0, rs);
    gen_load_gpr(tcg_ctx, t1, rt);

    switch (opc) {
    case MMI_OPC_MULT1:
        acc = 1;
        /* Fall through */
    case OPC_MULT:
        {
            TCGv_i32 t2 = tcg_temp_new_i32(tcg_ctx);
            TCGv_i32 t3 = tcg_temp_new_i32(tcg_ctx);
            tcg_gen_trunc_tl_i32(tcg_ctx, t2, t0);
            tcg_gen_trunc_tl_i32(tcg_ctx, t3, t1);
            tcg_gen_muls2_i32(tcg_ctx, t2, t3, t2, t3);
            if (rd) {
                tcg_gen_ext_i32_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t2);
            }
            tcg_gen_ext_i32_tl(tcg_ctx, tcg_ctx->cpu_LO[acc], t2);
            tcg_gen_ext_i32_tl(tcg_ctx, tcg_ctx->cpu_HI[acc], t3);
            tcg_temp_free_i32(tcg_ctx, t2);
            tcg_temp_free_i32(tcg_ctx, t3);
        }
        break;
    case MMI_OPC_MULTU1:
        acc = 1;
        /* Fall through */
    case OPC_MULTU:
        {
            TCGv_i32 t2 = tcg_temp_new_i32(tcg_ctx);
            TCGv_i32 t3 = tcg_temp_new_i32(tcg_ctx);
            tcg_gen_trunc_tl_i32(tcg_ctx, t2, t0);
            tcg_gen_trunc_tl_i32(tcg_ctx, t3, t1);
            tcg_gen_mulu2_i32(tcg_ctx, t2, t3, t2, t3);
            if (rd) {
                tcg_gen_ext_i32_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t2);
            }
            tcg_gen_ext_i32_tl(tcg_ctx, tcg_ctx->cpu_LO[acc], t2);
            tcg_gen_ext_i32_tl(tcg_ctx, tcg_ctx->cpu_HI[acc], t3);
            tcg_temp_free_i32(tcg_ctx, t2);
            tcg_temp_free_i32(tcg_ctx, t3);
        }
        break;
    case MMI_OPC_MADD1:
        acc = 1;
        /* Fall through */
    case MMI_OPC_MADD:
        {
            TCGv_i64 t2 = tcg_temp_new_i64(tcg_ctx);
            TCGv_i64 t3 = tcg_temp_new_i64(tcg_ctx);

            tcg_gen_ext_tl_i64(tcg_ctx, t2, t0);
            tcg_gen_ext_tl_i64(tcg_ctx, t3, t1);
            tcg_gen_mul_i64(tcg_ctx, t2, t2, t3);
            tcg_gen_concat_tl_i64(tcg_ctx, t3, tcg_ctx->cpu_LO[acc], tcg_ctx->cpu_HI[acc]);
            tcg_gen_add_i64(tcg_ctx, t2, t2, t3);
            tcg_temp_free_i64(tcg_ctx, t3);
            gen_move_low32(tcg_ctx, tcg_ctx->cpu_LO[acc], t2);
            gen_move_high32(tcg_ctx, tcg_ctx->cpu_HI[acc], t2);
            if (rd) {
                gen_move_low32(tcg_ctx, tcg_ctx->cpu_gpr[rd], t2);
            }
            tcg_temp_free_i64(tcg_ctx, t2);
        }
        break;
    case MMI_OPC_MADDU1:
        acc = 1;
        /* Fall through */
    case MMI_OPC_MADDU:
        {
            TCGv_i64 t2 = tcg_temp_new_i64(tcg_ctx);
            TCGv_i64 t3 = tcg_temp_new_i64(tcg_ctx);

            tcg_gen_ext32u_tl(tcg_ctx, t0, t0);
            tcg_gen_ext32u_tl(tcg_ctx, t1, t1);
            tcg_gen_extu_tl_i64(tcg_ctx, t2, t0);
            tcg_gen_extu_tl_i64(tcg_ctx, t3, t1);
            tcg_gen_mul_i64(tcg_ctx, t2, t2, t3);
            tcg_gen_concat_tl_i64(tcg_ctx, t3, tcg_ctx->cpu_LO[acc], tcg_ctx->cpu_HI[acc]);
            tcg_gen_add_i64(tcg_ctx, t2, t2, t3);
            tcg_temp_free_i64(tcg_ctx, t3);
            gen_move_low32(tcg_ctx, tcg_ctx->cpu_LO[acc], t2);
            gen_move_high32(tcg_ctx, tcg_ctx->cpu_HI[acc], t2);
            if (rd) {
                gen_move_low32(tcg_ctx, tcg_ctx->cpu_gpr[rd], t2);
            }
            tcg_temp_free_i64(tcg_ctx, t2);
        }
        break;
    default:
        MIPS_INVAL("mul/madd TXx9");
        generate_exception_end(ctx, EXCP_RI);
        goto out;
    }

 out:
    tcg_temp_free(tcg_ctx, t0);
    tcg_temp_free(tcg_ctx, t1);
}